

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QString * __thiscall
QFSCompleter::pathFromIndex(QString *__return_storage_ptr__,QFSCompleter *this,QModelIndex *index)

{
  char cVar1;
  QObject *object;
  QArrayDataPointer<char16_t> *other;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->proxyModel != (QAbstractProxyModel *)0x0) {
    object = (QObject *)QAbstractProxyModel::sourceModel();
    QtPrivate::qobject_cast_helper<QFileSystemModel_const*,QObject>(object);
  }
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModel::rootPath();
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data(&local_50,index,0x101);
  ::QVariant::toString();
  ::QVariant::~QVariant(&local_50);
  if (((undefined1 *)local_68.size == (undefined1 *)0x0) ||
     (cVar1 = QString::startsWith((QString *)&local_88,(CaseSensitivity)&local_68), cVar1 == '\0'))
  {
    QModelIndex::data(&local_50,index,0x101);
    ::QVariant::toString();
    ::QVariant::~QVariant(&local_50);
  }
  else {
    if (((undefined1 *)local_68.size != (undefined1 *)0x1) || (*local_68.ptr != L'/')) {
      QString::endsWith((QChar)(char16_t)&local_68,0x2f);
    }
    other = (QArrayDataPointer<char16_t> *)QString::remove((longlong)&local_88,0);
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,other);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFSCompleter::pathFromIndex(const QModelIndex &index) const
{
    const QFileSystemModel *dirModel;
    if (proxyModel)
        dirModel = qobject_cast<const QFileSystemModel *>(proxyModel->sourceModel());
    else
        dirModel = sourceModel;
    QString currentLocation = dirModel->rootPath();
    QString path = index.data(QFileSystemModel::FilePathRole).toString();
    if (!currentLocation.isEmpty() && path.startsWith(currentLocation)) {
#if defined(Q_OS_UNIX)
        if (currentLocation == QDir::separator())
            return path.remove(0, currentLocation.size());
#endif
        if (currentLocation.endsWith(u'/'))
            return path.remove(0, currentLocation.size());
        else
            return path.remove(0, currentLocation.size()+1);
    }
    return index.data(QFileSystemModel::FilePathRole).toString();
}